

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Convolution.cpp
# Opt level: O3

void CoreMLConverter::convertCaffeConvolution(ConvertLayerParameters layerParameters)

{
  RepeatedField<float> *pRVar1;
  RepeatedField<unsigned_long> *pRVar2;
  string *psVar3;
  string *psVar4;
  bool bVar5;
  char cVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  Type *pTVar10;
  Type *pTVar11;
  LayerUnion LVar12;
  LogMessage *pLVar13;
  Rep *pRVar14;
  long *plVar15;
  BorderAmounts *pBVar16;
  Type *pTVar17;
  ValidPadding *pVVar18;
  WeightParams *pWVar19;
  uint uVar20;
  size_type *psVar21;
  ulong uVar22;
  BoxCoordinatesMode *pBVar23;
  ulong uVar24;
  undefined8 *puVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  ConvolutionParameter *from;
  Type *pTVar29;
  uint64 uVar30;
  ulong *puVar31;
  long lVar32;
  long lVar33;
  void **ppvVar34;
  void *pvVar35;
  uint uVar36;
  void *pvVar37;
  string __str_5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000028;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_00000030;
  int *in_stack_00000048;
  string __str;
  string __str_1;
  string __str_3;
  string __str_4;
  ConvolutionParameter caffeLayerParams;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  string local_280;
  undefined1 local_260 [56];
  LayerUnion local_228;
  bool local_219;
  Type *local_218;
  ulong *local_210;
  long local_208;
  ulong local_200;
  long lStack_1f8;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0;
  long lStack_1d8;
  long *local_1d0;
  undefined8 local_1c8;
  long local_1c0;
  undefined8 uStack_1b8;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0;
  long lStack_198;
  uint64 local_190;
  Type *local_188;
  Type *local_180;
  uint64 local_178;
  ulong local_170;
  ulong local_168;
  ulong *local_160;
  uint local_158;
  undefined4 uStack_154;
  ulong local_150 [2];
  ulong *local_140;
  long local_138;
  ulong local_130 [2];
  undefined1 local_120 [32];
  Rep *local_100;
  uint local_f8;
  Rep *local_f0;
  uint local_e8;
  Rep *local_e0;
  uint local_d8;
  Rep *local_d0;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint32 local_a0;
  uint local_94;
  bool local_90;
  uint local_8c;
  ulong *local_88;
  uint local_80;
  ulong local_78 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                      ((RepeatedPtrFieldBase *)(__str_5._M_dataplus._M_p + 0x70),*in_stack_00000048)
  ;
  iVar8 = getLayerIndex(pTVar10,in_stack_00000030);
  pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                      ((RepeatedPtrFieldBase *)(__str_5._M_string_length + 0x70),iVar8);
  local_188 = google::protobuf::internal::RepeatedPtrFieldBase::
              Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                        ((RepeatedPtrFieldBase *)__str_5.field_2._M_allocated_capacity,(Type *)0x0);
  if (((pTVar10->bottom_).super_RepeatedPtrFieldBase.current_size_ != 1) ||
     (iVar8 = 1, (pTVar10->top_).super_RepeatedPtrFieldBase.current_size_ != 1)) {
    local_120._0_8_ = local_120 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_120,"Must have 1 input and 1 output","");
    errorInCaffeProto((string *)local_120,(pTVar10->name_).ptr_,(pTVar10->type_).ptr_);
    if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
      operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
    }
    iVar8 = (pTVar10->bottom_).super_RepeatedPtrFieldBase.current_size_;
  }
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar14 = (pTVar10->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar34 = pRVar14->elements;
  if (pRVar14 == (Rep *)0x0) {
    ppvVar34 = (void **)0x0;
  }
  local_218 = pTVar10;
  local_180 = pTVar11;
  if (iVar8 != 0) {
    lVar32 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_48,*(value_type **)((long)ppvVar34 + lVar32));
      lVar32 = lVar32 + 8;
    } while ((long)iVar8 * 8 != lVar32);
  }
  pRVar14 = (local_218->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar34 = pRVar14->elements;
  if (pRVar14 == (Rep *)0x0) {
    ppvVar34 = (void **)0x0;
  }
  lVar32 = (long)(local_218->top_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar32 != 0) {
    lVar33 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_68,*(value_type **)((long)ppvVar34 + lVar33));
      lVar33 = lVar33 + 8;
    } while (lVar32 * 8 != lVar33);
  }
  pTVar10 = local_218;
  convertCaffeMetadata
            ((local_218->name_).ptr_,&local_48,&local_68,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
             __str_5.field_2._M_allocated_capacity,in_stack_00000028);
  pTVar29 = local_188;
  from = pTVar10->convolution_param_;
  if (from == (ConvolutionParameter *)0x0) {
    from = (ConvolutionParameter *)&caffe::_ConvolutionParameter_default_instance_;
  }
  caffe::ConvolutionParameter::ConvolutionParameter((ConvolutionParameter *)local_120,from);
  pTVar11 = local_180;
  if (pTVar29->_oneof_case_[0] == 100) {
    local_228 = pTVar29->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar29);
    pTVar29->_oneof_case_[0] = 100;
    LVar12.convolution_ = (ConvolutionLayerParams *)operator_new(0xb0);
    CoreML::Specification::ConvolutionLayerParams::ConvolutionLayerParams(LVar12.convolution_);
    (pTVar29->layer_).convolution_ = (ConvolutionLayerParams *)LVar12;
    local_228.convolution_ = LVar12.convolution_;
  }
  local_188 = (Type *)(ulong)local_b8;
  if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ == 0) {
    local_260._0_8_ = local_260 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_260,"Weight blobs not provided","");
    errorInCaffeProto((string *)local_260,(pTVar10->name_).ptr_,(pTVar10->type_).ptr_);
    if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
      operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
    }
  }
  local_190 = (uint64)local_8c;
  if (local_190 == 0) {
    local_260._0_8_ = local_260 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_260,"group parameter cannot be 0","");
    errorInCaffeProto((string *)local_260,(pTVar10->name_).ptr_,(pTVar10->type_).ptr_);
    if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
      operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
    }
  }
  if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ - 1U < 2) {
    pRVar14 = (pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_;
    puVar25 = *(undefined8 **)((long)pRVar14->elements[0] + 0x78);
    if (puVar25 == (undefined8 *)0x0) {
      puVar25 = &caffe::_BlobShape_default_instance_;
    }
    if (*(int *)(puVar25 + 3) == 0) {
      if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_260,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar13 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_260,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_280,pLVar13);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_260);
        pRVar14 = (pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_;
        iVar8 = *(int *)((long)pRVar14->elements[0] + 0x80);
        if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_260,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar13 = google::protobuf::internal::LogMessage::operator<<
                              ((LogMessage *)local_260,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_280,pLVar13);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_260);
          pRVar14 = (pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_;
        }
      }
      else {
        iVar8 = *(int *)((long)pRVar14->elements[0] + 0x80);
      }
      uVar26 = (ulong)iVar8;
      local_178 = (uint64)*(int *)((long)pRVar14->elements[0] + 0x84);
    }
    else {
      iVar9 = std::__cxx11::string::compare((char *)(pTVar10->type_).ptr_);
      iVar8 = (pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_;
      if (iVar9 == 0) {
        if (iVar8 < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_260,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar13 = google::protobuf::internal::LogMessage::operator<<
                              ((LogMessage *)local_260,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_280,pLVar13);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_260);
        }
        puVar25 = *(undefined8 **)
                   ((long)((pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
        if (puVar25 == (undefined8 *)0x0) {
          puVar25 = &caffe::_BlobShape_default_instance_;
        }
        if (*(int *)(puVar25 + 3) < 2) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_260,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x476);
          pLVar13 = google::protobuf::internal::LogMessage::operator<<
                              ((LogMessage *)local_260,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_280,pLVar13);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_260);
        }
        uVar26 = *(ulong *)(puVar25[4] + 0x10);
        if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_260,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar13 = google::protobuf::internal::LogMessage::operator<<
                              ((LogMessage *)local_260,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_280,pLVar13);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_260);
        }
        puVar25 = *(undefined8 **)
                   ((long)((pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
        if (puVar25 == (undefined8 *)0x0) {
          puVar25 = &caffe::_BlobShape_default_instance_;
        }
        if (*(int *)(puVar25 + 3) < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_260,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x476);
          pLVar13 = google::protobuf::internal::LogMessage::operator<<
                              ((LogMessage *)local_260,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_280,pLVar13);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_260);
        }
        local_178 = *(uint64 *)(puVar25[4] + 8);
      }
      else {
        if (iVar8 < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_260,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar13 = google::protobuf::internal::LogMessage::operator<<
                              ((LogMessage *)local_260,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_280,pLVar13);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_260);
        }
        puVar25 = *(undefined8 **)
                   ((long)((pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
        if (puVar25 == (undefined8 *)0x0) {
          puVar25 = &caffe::_BlobShape_default_instance_;
        }
        if (*(int *)(puVar25 + 3) < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_260,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x476);
          pLVar13 = google::protobuf::internal::LogMessage::operator<<
                              ((LogMessage *)local_260,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_280,pLVar13);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_260);
        }
        uVar26 = *(ulong *)(puVar25[4] + 8);
        if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_260,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar13 = google::protobuf::internal::LogMessage::operator<<
                              ((LogMessage *)local_260,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_280,pLVar13);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_260);
        }
        puVar25 = *(undefined8 **)
                   ((long)((pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
        if (puVar25 == (undefined8 *)0x0) {
          puVar25 = &caffe::_BlobShape_default_instance_;
        }
        if (*(int *)(puVar25 + 3) < 2) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_260,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x476);
          pLVar13 = google::protobuf::internal::LogMessage::operator<<
                              ((LogMessage *)local_260,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_280,pLVar13);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_260);
        }
        local_178 = *(uint64 *)(puVar25[4] + 0x10);
      }
    }
  }
  else {
    local_260._0_8_ = local_260 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_260,"Number of blobs must be 2 or 1 (when there is no bias)","");
    errorInCaffeProto((string *)local_260,(pTVar10->name_).ptr_,(pTVar10->type_).ptr_);
    if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
      operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
    }
    local_178 = 0;
    uVar26 = 0;
  }
  local_170 = 0;
  if (1 < (pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_) {
    local_170 = (ulong)*(uint *)(*(long *)((pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_ + 1) +
                                0x18);
  }
  local_219 = local_90;
  iVar8 = std::__cxx11::string::compare((char *)(pTVar10->type_).ptr_);
  uVar27 = (uint)local_188;
  LVar12 = local_228;
  local_168 = uVar26;
  if (iVar8 == 0) {
    if (uVar26 * local_190 - (long)local_188 != 0) {
      cVar7 = '\x01';
      if (9 < uVar27) {
        pTVar29 = local_188;
        cVar6 = '\x04';
        do {
          cVar7 = cVar6;
          uVar28 = (uint)pTVar29;
          if (uVar28 < 100) {
            cVar7 = cVar7 + -2;
            goto LAB_003e9b1c;
          }
          if (uVar28 < 1000) {
            cVar7 = cVar7 + -1;
            goto LAB_003e9b1c;
          }
          if (uVar28 < 10000) goto LAB_003e9b1c;
          pTVar29 = (Type *)(((ulong)pTVar29 & 0xffffffff) / 10000);
          cVar6 = cVar7 + '\x04';
        } while (99999 < uVar28);
        cVar7 = cVar7 + '\x01';
      }
LAB_003e9b1c:
      local_88 = local_78;
      std::__cxx11::string::_M_construct((ulong)&local_88,cVar7);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_88,local_80,uVar27);
      plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,0x5e4ff8);
      uVar26 = local_168;
      local_1f0 = &local_1e0;
      puVar31 = (ulong *)(plVar15 + 2);
      if ((ulong *)*plVar15 == puVar31) {
        local_1e0 = *puVar31;
        lStack_1d8 = plVar15[3];
      }
      else {
        local_1e0 = *puVar31;
        local_1f0 = (ulong *)*plVar15;
      }
      local_1e8 = plVar15[1];
      *plVar15 = (long)puVar31;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_1f0);
      puVar31 = (ulong *)(plVar15 + 2);
      if ((ulong *)*plVar15 == puVar31) {
        local_1a0 = *puVar31;
        lStack_198 = plVar15[3];
        local_1b0 = &local_1a0;
      }
      else {
        local_1a0 = *puVar31;
        local_1b0 = (ulong *)*plVar15;
      }
      local_1a8 = plVar15[1];
      *plVar15 = (long)puVar31;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      cVar7 = '\x01';
      if (9 < (uint)local_190) {
        uVar30 = local_190;
        cVar6 = '\x04';
        do {
          cVar7 = cVar6;
          uVar27 = (uint)uVar30;
          if (uVar27 < 100) {
            cVar7 = cVar7 + -2;
            goto LAB_003e9c7b;
          }
          if (uVar27 < 1000) {
            cVar7 = cVar7 + -1;
            goto LAB_003e9c7b;
          }
          if (uVar27 < 10000) goto LAB_003e9c7b;
          uVar30 = (uVar30 & 0xffffffff) / 10000;
          cVar6 = cVar7 + '\x04';
        } while (99999 < uVar27);
        cVar7 = cVar7 + '\x01';
      }
LAB_003e9c7b:
      local_160 = local_150;
      std::__cxx11::string::_M_construct((ulong)&local_160,cVar7);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_160,local_158,(uint)local_190);
      uVar24 = CONCAT44(uStack_154,local_158) + local_1a8;
      uVar22 = 0xf;
      if (local_1b0 != &local_1a0) {
        uVar22 = local_1a0;
      }
      if (uVar22 < uVar24) {
        uVar22 = 0xf;
        if (local_160 != local_150) {
          uVar22 = local_150[0];
        }
        if (uVar22 < uVar24) goto LAB_003e9d06;
        puVar25 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_160,0,(char *)0x0,(ulong)local_1b0);
      }
      else {
LAB_003e9d06:
        puVar25 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_160)
        ;
      }
      local_1d0 = &local_1c0;
      plVar15 = puVar25 + 2;
      if ((long *)*puVar25 == plVar15) {
        local_1c0 = *plVar15;
        uStack_1b8 = puVar25[3];
      }
      else {
        local_1c0 = *plVar15;
        local_1d0 = (long *)*puVar25;
      }
      local_1c8 = puVar25[1];
      *puVar25 = plVar15;
      puVar25[1] = 0;
      *(undefined1 *)plVar15 = 0;
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_1d0);
      puVar31 = (ulong *)(plVar15 + 2);
      if ((ulong *)*plVar15 == puVar31) {
        local_200 = *puVar31;
        lStack_1f8 = plVar15[3];
        local_210 = &local_200;
      }
      else {
        local_200 = *puVar31;
        local_210 = (ulong *)*plVar15;
      }
      local_208 = plVar15[1];
      *plVar15 = (long)puVar31;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      uVar24 = -uVar26;
      if (0 < (long)uVar26) {
        uVar24 = uVar26;
      }
      uVar27 = 1;
      if (9 < uVar24) {
        uVar22 = uVar24;
        uVar28 = 4;
        do {
          uVar27 = uVar28;
          if (uVar22 < 100) {
            uVar27 = uVar27 - 2;
            goto LAB_003e9e41;
          }
          if (uVar22 < 1000) {
            uVar27 = uVar27 - 1;
            goto LAB_003e9e41;
          }
          if (uVar22 < 10000) goto LAB_003e9e41;
          bVar5 = 99999 < uVar22;
          uVar22 = uVar22 / 10000;
          uVar28 = uVar27 + 4;
        } while (bVar5);
        uVar27 = uVar27 + 1;
      }
LAB_003e9e41:
      local_140 = local_130;
      std::__cxx11::string::_M_construct
                ((ulong)&local_140,(char)uVar27 - (char)((long)uVar26 >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)((long)local_140 - ((long)uVar26 >> 0x3f)),uVar27,uVar24);
      uVar26 = 0xf;
      if (local_210 != &local_200) {
        uVar26 = local_200;
      }
      if (uVar26 < (ulong)(local_138 + local_208)) {
        uVar26 = 0xf;
        if (local_140 != local_130) {
          uVar26 = local_130[0];
        }
        if (uVar26 < (ulong)(local_138 + local_208)) goto LAB_003e9ecc;
        puVar25 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,(ulong)local_210);
      }
      else {
LAB_003e9ecc:
        puVar25 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_140)
        ;
      }
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      psVar21 = puVar25 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar25 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar21) {
        local_280.field_2._M_allocated_capacity = *psVar21;
        local_280.field_2._8_8_ = puVar25[3];
      }
      else {
        local_280.field_2._M_allocated_capacity = *psVar21;
        local_280._M_dataplus._M_p = (pointer)*puVar25;
      }
      local_280._M_string_length = puVar25[1];
      *puVar25 = psVar21;
      puVar25[1] = 0;
      *(undefined1 *)psVar21 = 0;
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_280);
      psVar21 = (size_type *)(plVar15 + 2);
      if ((size_type *)*plVar15 == psVar21) {
        local_260._16_8_ = *psVar21;
        local_260._24_8_ = plVar15[3];
        local_260._0_8_ = local_260 + 0x10;
      }
      else {
        local_260._16_8_ = *psVar21;
        local_260._0_8_ = (size_type *)*plVar15;
      }
      local_260._8_8_ = plVar15[1];
      *plVar15 = (long)psVar21;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      errorInCaffeProto((string *)local_260,(local_218->name_).ptr_,(local_218->type_).ptr_);
      if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
        operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
      }
      if (local_140 != local_130) {
        operator_delete(local_140,local_130[0] + 1);
      }
      LVar12 = local_228;
      if (local_210 != &local_200) {
        operator_delete(local_210,local_200 + 1);
      }
      if (local_1d0 != &local_1c0) {
        operator_delete(local_1d0,local_1c0 + 1);
      }
      if (local_160 != local_150) {
        operator_delete(local_160,local_150[0] + 1);
      }
      if (local_1b0 != &local_1a0) {
        operator_delete(local_1b0,local_1a0 + 1);
      }
      pTVar10 = local_218;
      if (local_1f0 != &local_1e0) {
        operator_delete(local_1f0,local_1e0 + 1);
      }
      puVar31 = local_88;
      if (local_88 != local_78) goto LAB_003ea0bb;
    }
  }
  else {
    pTVar29 = local_188;
    if ((Type *)uVar26 != local_188) {
      cVar7 = '\x01';
      if (9 < uVar27) {
        cVar6 = '\x04';
        do {
          cVar7 = cVar6;
          uVar28 = (uint)pTVar29;
          if (uVar28 < 100) {
            cVar7 = cVar7 + -2;
            goto LAB_003e93cd;
          }
          if (uVar28 < 1000) {
            cVar7 = cVar7 + -1;
            goto LAB_003e93cd;
          }
          if (uVar28 < 10000) goto LAB_003e93cd;
          pTVar29 = (Type *)(((ulong)pTVar29 & 0xffffffff) / 10000);
          cVar6 = cVar7 + '\x04';
        } while (99999 < uVar28);
        cVar7 = cVar7 + '\x01';
      }
LAB_003e93cd:
      local_1b0 = &local_1a0;
      std::__cxx11::string::_M_construct((ulong)&local_1b0,cVar7);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1b0,(uint)local_1a8,uVar27);
      puVar25 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,0x5e4ff8);
      local_1d0 = &local_1c0;
      plVar15 = puVar25 + 2;
      if ((long *)*puVar25 == plVar15) {
        local_1c0 = *plVar15;
        uStack_1b8 = puVar25[3];
      }
      else {
        local_1c0 = *plVar15;
        local_1d0 = (long *)*puVar25;
      }
      local_1c8 = puVar25[1];
      *puVar25 = plVar15;
      puVar25[1] = 0;
      *(undefined1 *)(puVar25 + 2) = 0;
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_1d0);
      puVar31 = (ulong *)(plVar15 + 2);
      if ((ulong *)*plVar15 == puVar31) {
        local_200 = *puVar31;
        lStack_1f8 = plVar15[3];
        local_210 = &local_200;
      }
      else {
        local_200 = *puVar31;
        local_210 = (ulong *)*plVar15;
      }
      local_208 = plVar15[1];
      *plVar15 = (long)puVar31;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      uVar24 = -uVar26;
      if (0 < (long)uVar26) {
        uVar24 = uVar26;
      }
      uVar27 = 1;
      if (9 < uVar24) {
        uVar22 = uVar24;
        uVar28 = 4;
        do {
          uVar27 = uVar28;
          if (uVar22 < 100) {
            uVar27 = uVar27 - 2;
            goto LAB_003e952d;
          }
          if (uVar22 < 1000) {
            uVar27 = uVar27 - 1;
            goto LAB_003e952d;
          }
          if (uVar22 < 10000) goto LAB_003e952d;
          bVar5 = 99999 < uVar22;
          uVar22 = uVar22 / 10000;
          uVar28 = uVar27 + 4;
        } while (bVar5);
        uVar27 = uVar27 + 1;
      }
LAB_003e952d:
      local_1f0 = &local_1e0;
      std::__cxx11::string::_M_construct
                ((ulong)&local_1f0,(char)uVar27 - (char)((long)uVar26 >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)((long)local_1f0 - ((long)uVar26 >> 0x3f)),uVar27,uVar24);
      uVar26 = 0xf;
      if (local_210 != &local_200) {
        uVar26 = local_200;
      }
      if (uVar26 < (ulong)(local_1e8 + local_208)) {
        uVar26 = 0xf;
        if (local_1f0 != &local_1e0) {
          uVar26 = local_1e0;
        }
        if (uVar26 < (ulong)(local_1e8 + local_208)) goto LAB_003e95b8;
        puVar25 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_210);
      }
      else {
LAB_003e95b8:
        puVar25 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_1f0)
        ;
      }
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      psVar21 = puVar25 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar25 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar21) {
        local_280.field_2._M_allocated_capacity = *psVar21;
        local_280.field_2._8_8_ = puVar25[3];
      }
      else {
        local_280.field_2._M_allocated_capacity = *psVar21;
        local_280._M_dataplus._M_p = (pointer)*puVar25;
      }
      local_280._M_string_length = puVar25[1];
      *puVar25 = psVar21;
      puVar25[1] = 0;
      *(undefined1 *)psVar21 = 0;
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_280);
      psVar21 = (size_type *)(plVar15 + 2);
      if ((size_type *)*plVar15 == psVar21) {
        local_260._16_8_ = *psVar21;
        local_260._24_8_ = plVar15[3];
        local_260._0_8_ = local_260 + 0x10;
      }
      else {
        local_260._16_8_ = *psVar21;
        local_260._0_8_ = (size_type *)*plVar15;
      }
      local_260._8_8_ = plVar15[1];
      *plVar15 = (long)psVar21;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      errorInCaffeProto((string *)local_260,(local_218->name_).ptr_,(local_218->type_).ptr_);
      if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
        operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
      }
      if (local_1f0 != &local_1e0) {
        operator_delete(local_1f0,local_1e0 + 1);
      }
      pTVar29 = local_188;
      LVar12 = local_228;
      if (local_210 != &local_200) {
        operator_delete(local_210,local_200 + 1);
      }
      pTVar10 = local_218;
      if (local_1d0 != &local_1c0) {
        operator_delete(local_1d0,local_1c0 + 1);
      }
      if (local_1b0 != &local_1a0) {
        operator_delete(local_1b0,local_1a0 + 1);
      }
    }
    uVar27 = (uint)pTVar29;
    if ((int)(((ulong)pTVar29 & 0xffffffff) % (local_190 & 0xffffffff)) == 0) goto LAB_003ea0c3;
    cVar7 = '\x01';
    if (9 < uVar27) {
      cVar6 = '\x04';
      do {
        cVar7 = cVar6;
        uVar28 = (uint)pTVar29;
        if (uVar28 < 100) {
          cVar7 = cVar7 + -2;
          goto LAB_003e97b0;
        }
        if (uVar28 < 1000) {
          cVar7 = cVar7 + -1;
          goto LAB_003e97b0;
        }
        if (uVar28 < 10000) goto LAB_003e97b0;
        pTVar29 = (Type *)(((ulong)pTVar29 & 0xffffffff) / 10000);
        cVar6 = cVar7 + '\x04';
      } while (99999 < uVar28);
      cVar7 = cVar7 + '\x01';
    }
LAB_003e97b0:
    local_1b0 = &local_1a0;
    std::__cxx11::string::_M_construct((ulong)&local_1b0,cVar7);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1b0,(uint)local_1a8,uVar27);
    puVar25 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,0x5e4ff8);
    plVar15 = puVar25 + 2;
    if ((long *)*puVar25 == plVar15) {
      local_1c0 = *plVar15;
      uStack_1b8 = puVar25[3];
      local_1d0 = &local_1c0;
    }
    else {
      local_1c0 = *plVar15;
      local_1d0 = (long *)*puVar25;
    }
    local_1c8 = puVar25[1];
    *puVar25 = plVar15;
    puVar25[1] = 0;
    *(undefined1 *)(puVar25 + 2) = 0;
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_1d0);
    puVar31 = (ulong *)(plVar15 + 2);
    if ((ulong *)*plVar15 == puVar31) {
      local_200 = *puVar31;
      lStack_1f8 = plVar15[3];
      local_210 = &local_200;
    }
    else {
      local_200 = *puVar31;
      local_210 = (ulong *)*plVar15;
    }
    local_208 = plVar15[1];
    *plVar15 = (long)puVar31;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    cVar7 = '\x01';
    if (9 < (uint)local_190) {
      uVar30 = local_190;
      cVar6 = '\x04';
      do {
        cVar7 = cVar6;
        uVar27 = (uint)uVar30;
        if (uVar27 < 100) {
          cVar7 = cVar7 + -2;
          goto LAB_003e9908;
        }
        if (uVar27 < 1000) {
          cVar7 = cVar7 + -1;
          goto LAB_003e9908;
        }
        if (uVar27 < 10000) goto LAB_003e9908;
        uVar30 = (uVar30 & 0xffffffff) / 10000;
        cVar6 = cVar7 + '\x04';
      } while (99999 < uVar27);
      cVar7 = cVar7 + '\x01';
    }
LAB_003e9908:
    local_1f0 = &local_1e0;
    std::__cxx11::string::_M_construct((ulong)&local_1f0,cVar7);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)local_1f0,(uint)local_1e8,(uint)local_190);
    uVar26 = 0xf;
    if (local_210 != &local_200) {
      uVar26 = local_200;
    }
    if (uVar26 < (ulong)(local_1e8 + local_208)) {
      uVar26 = 0xf;
      if (local_1f0 != &local_1e0) {
        uVar26 = local_1e0;
      }
      if (uVar26 < (ulong)(local_1e8 + local_208)) goto LAB_003e9990;
      puVar25 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_210);
    }
    else {
LAB_003e9990:
      puVar25 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_1f0);
    }
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    psVar21 = puVar25 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar25 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar21) {
      local_280.field_2._M_allocated_capacity = *psVar21;
      local_280.field_2._8_8_ = puVar25[3];
    }
    else {
      local_280.field_2._M_allocated_capacity = *psVar21;
      local_280._M_dataplus._M_p = (pointer)*puVar25;
    }
    local_280._M_string_length = puVar25[1];
    *puVar25 = psVar21;
    puVar25[1] = 0;
    *(undefined1 *)psVar21 = 0;
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_280);
    psVar21 = (size_type *)(plVar15 + 2);
    if ((size_type *)*plVar15 == psVar21) {
      local_260._16_8_ = *psVar21;
      local_260._24_8_ = plVar15[3];
      local_260._0_8_ = local_260 + 0x10;
    }
    else {
      local_260._16_8_ = *psVar21;
      local_260._0_8_ = (size_type *)*plVar15;
    }
    local_260._8_8_ = plVar15[1];
    *plVar15 = (long)psVar21;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    errorInCaffeProto((string *)local_260,(local_218->name_).ptr_,(local_218->type_).ptr_);
    if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
      operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
    }
    pTVar10 = local_218;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if (local_1f0 != &local_1e0) {
      operator_delete(local_1f0,local_1e0 + 1);
    }
    if (local_210 != &local_200) {
      operator_delete(local_210,local_200 + 1);
    }
    LVar12 = local_228;
    if (local_1d0 != &local_1c0) {
      operator_delete(local_1d0,local_1c0 + 1);
    }
    local_78[0] = local_1a0;
    puVar31 = local_1b0;
    if (local_1b0 != &local_1a0) {
LAB_003ea0bb:
      operator_delete(puVar31,local_78[0] + 1);
    }
  }
LAB_003ea0c3:
  bVar5 = (int)local_170 < 1;
  if (local_219 != false) {
    bVar5 = (int)local_170 != 0;
  }
  if (!bVar5) {
    local_260._0_8_ = local_260 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_260,"\'bias_term\' flag and blob size for bias incompatible","");
    errorInCaffeProto((string *)local_260,(pTVar10->name_).ptr_,(pTVar10->type_).ptr_);
    if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
      operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
    }
  }
  if (local_94 != 1) {
    local_260._0_8_ = local_260 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"axis","");
    uVar27 = -local_94;
    if (0 < (int)local_94) {
      uVar27 = local_94;
    }
    uVar28 = 1;
    if (9 < uVar27) {
      uVar26 = (ulong)uVar27;
      uVar36 = 4;
      do {
        uVar28 = uVar36;
        uVar20 = (uint)uVar26;
        if (uVar20 < 100) {
          uVar28 = uVar28 - 2;
          goto LAB_003ea1bf;
        }
        if (uVar20 < 1000) {
          uVar28 = uVar28 - 1;
          goto LAB_003ea1bf;
        }
        if (uVar20 < 10000) goto LAB_003ea1bf;
        uVar26 = uVar26 / 10000;
        uVar36 = uVar28 + 4;
      } while (99999 < uVar20);
      uVar28 = uVar28 + 1;
    }
LAB_003ea1bf:
    psVar3 = (local_218->name_).ptr_;
    psVar4 = (local_218->type_).ptr_;
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct
              ((ulong)&local_280,(char)uVar28 - (char)((int)local_94 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_280._M_dataplus._M_p + (local_94 >> 0x1f),uVar28,uVar27);
    unsupportedCaffeParrameterWithOption((string *)local_260,psVar3,psVar4,&local_280);
    pTVar10 = local_218;
    LVar12 = local_228;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
      operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
    }
  }
  if (2 < (int)local_f8) {
    local_260._0_8_ = local_260 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_260,"Number of kernel size values","");
    uVar27 = -local_f8;
    if (0 < (int)local_f8) {
      uVar27 = local_f8;
    }
    uVar28 = 1;
    if (9 < uVar27) {
      uVar26 = (ulong)uVar27;
      uVar36 = 4;
      do {
        uVar28 = uVar36;
        uVar20 = (uint)uVar26;
        if (uVar20 < 100) {
          uVar28 = uVar28 - 2;
          goto LAB_003ea2ea;
        }
        if (uVar20 < 1000) {
          uVar28 = uVar28 - 1;
          goto LAB_003ea2ea;
        }
        if (uVar20 < 10000) goto LAB_003ea2ea;
        uVar26 = uVar26 / 10000;
        uVar36 = uVar28 + 4;
      } while (99999 < uVar20);
      uVar28 = uVar28 + 1;
    }
LAB_003ea2ea:
    psVar3 = (local_218->name_).ptr_;
    psVar4 = (local_218->type_).ptr_;
    uVar36 = local_f8 >> 0x1f;
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct
              ((ulong)&local_280,(char)uVar28 - (char)((int)local_f8 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_280._M_dataplus._M_p + uVar36,uVar28,uVar27);
    unsupportedCaffeParrameterWithOption((string *)local_260,psVar3,psVar4,&local_280);
    pTVar10 = local_218;
    LVar12 = local_228;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
      operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
    }
  }
  if (2 < (int)local_120._24_4_) {
    local_260._0_8_ = local_260 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"Number of pad values","");
    uVar27 = -local_120._24_4_;
    if (0 < (int)local_120._24_4_) {
      uVar27 = local_120._24_4_;
    }
    uVar28 = 1;
    if (9 < uVar27) {
      uVar26 = (ulong)uVar27;
      uVar36 = 4;
      do {
        uVar28 = uVar36;
        uVar20 = (uint)uVar26;
        if (uVar20 < 100) {
          uVar28 = uVar28 - 2;
          goto LAB_003ea415;
        }
        if (uVar20 < 1000) {
          uVar28 = uVar28 - 1;
          goto LAB_003ea415;
        }
        if (uVar20 < 10000) goto LAB_003ea415;
        uVar26 = uVar26 / 10000;
        uVar36 = uVar28 + 4;
      } while (99999 < uVar20);
      uVar28 = uVar28 + 1;
    }
LAB_003ea415:
    psVar3 = (local_218->name_).ptr_;
    psVar4 = (local_218->type_).ptr_;
    uVar36 = (uint)local_120._24_4_ >> 0x1f;
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct
              ((ulong)&local_280,(char)uVar28 - (SUB41(local_120._24_4_,3) >> 7));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_280._M_dataplus._M_p + uVar36,uVar28,uVar27);
    unsupportedCaffeParrameterWithOption((string *)local_260,psVar3,psVar4,&local_280);
    pTVar10 = local_218;
    LVar12 = local_228;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
      operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
    }
  }
  if (2 < (int)local_e8) {
    local_260._0_8_ = local_260 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_260,"Number of stride values","");
    uVar27 = -local_e8;
    if (0 < (int)local_e8) {
      uVar27 = local_e8;
    }
    uVar28 = 1;
    if (9 < uVar27) {
      uVar26 = (ulong)uVar27;
      uVar36 = 4;
      do {
        uVar28 = uVar36;
        uVar20 = (uint)uVar26;
        if (uVar20 < 100) {
          uVar28 = uVar28 - 2;
          goto LAB_003ea540;
        }
        if (uVar20 < 1000) {
          uVar28 = uVar28 - 1;
          goto LAB_003ea540;
        }
        if (uVar20 < 10000) goto LAB_003ea540;
        uVar26 = uVar26 / 10000;
        uVar36 = uVar28 + 4;
      } while (99999 < uVar20);
      uVar28 = uVar28 + 1;
    }
LAB_003ea540:
    psVar3 = (local_218->name_).ptr_;
    psVar4 = (local_218->type_).ptr_;
    uVar36 = local_e8 >> 0x1f;
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct
              ((ulong)&local_280,(char)uVar28 - (char)((int)local_e8 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_280._M_dataplus._M_p + uVar36,uVar28,uVar27);
    unsupportedCaffeParrameterWithOption((string *)local_260,psVar3,psVar4,&local_280);
    pTVar10 = local_218;
    LVar12 = local_228;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
      operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
    }
  }
  if (2 < (int)local_d8) {
    local_260._0_8_ = local_260 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_260,"Number of dilation size values","");
    uVar27 = -local_d8;
    if (0 < (int)local_d8) {
      uVar27 = local_d8;
    }
    uVar28 = 1;
    if (9 < uVar27) {
      uVar26 = (ulong)uVar27;
      uVar36 = 4;
      do {
        uVar28 = uVar36;
        uVar20 = (uint)uVar26;
        if (uVar20 < 100) {
          uVar28 = uVar28 - 2;
          goto LAB_003ea66b;
        }
        if (uVar20 < 1000) {
          uVar28 = uVar28 - 1;
          goto LAB_003ea66b;
        }
        if (uVar20 < 10000) goto LAB_003ea66b;
        uVar26 = uVar26 / 10000;
        uVar36 = uVar28 + 4;
      } while (99999 < uVar20);
      uVar28 = uVar28 + 1;
    }
LAB_003ea66b:
    psVar3 = (local_218->name_).ptr_;
    psVar4 = (local_218->type_).ptr_;
    uVar36 = local_d8 >> 0x1f;
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct
              ((ulong)&local_280,(char)uVar28 - (char)((int)local_d8 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_280._M_dataplus._M_p + uVar36,uVar28,uVar27);
    unsupportedCaffeParrameterWithOption((string *)local_260,psVar3,psVar4,&local_280);
    pTVar10 = local_218;
    LVar12 = local_228;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
      operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
    }
  }
  iVar8 = std::__cxx11::string::compare((char *)(pTVar10->type_).ptr_);
  (LVar12.convolution_)->isdeconvolution_ = iVar8 == 0;
  (LVar12.convolution_)->hasbias_ = local_219;
  (LVar12.convolution_)->ngroups_ = local_190;
  pRVar2 = &(LVar12.convolution_)->stride_;
  if (((LVar12.convolution_)->stride_).current_size_ < 2) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(pRVar2,2);
    lVar32 = (long)pRVar2->current_size_;
    if (lVar32 != 2) {
      memset(&(LVar12.cropresize_)->boxindicesmode_->_internal_metadata_ + lVar32,0,
             lVar32 * -8 + 0x10);
    }
  }
  pRVar2->current_size_ = 2;
  if (local_e8 == 0) {
    if (local_a4 == 0) {
      uVar27 = 1;
      uVar28 = 1;
    }
    else {
      uVar28 = local_a0 + (local_a0 == 0);
      uVar27 = local_a4;
      if (local_a0 == 0) {
        uVar27 = 1;
      }
    }
  }
  else {
    if ((int)local_e8 < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_260,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar13 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_260,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_280,pLVar13);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_260);
    }
    uVar27 = local_e0->elements[0];
    uVar28 = uVar27;
    if (local_e8 != 1) {
      if ((int)local_e8 < 2) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_260,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x476);
        pLVar13 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_260,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_280,pLVar13);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_260);
      }
      uVar28 = *(uint *)&local_e0->field_0xc;
    }
  }
  iVar8 = pRVar2->current_size_;
  if (iVar8 < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_260,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x484);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_260,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_280,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_260);
    iVar8 = pRVar2->current_size_;
  }
  pBVar23 = (LVar12.cropresize_)->boxindicesmode_;
  (pBVar23->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)(ulong)uVar27;
  if (iVar8 < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_260,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x484);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_260,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_280,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_260);
    pBVar23 = (LVar12.cropresize_)->boxindicesmode_;
  }
  pBVar23->boxmode_ = (int)(ulong)uVar28;
  pBVar23->_cached_size_ = (int)((ulong)uVar28 >> 0x20);
  pRVar2 = &(LVar12.convolution_)->kernelsize_;
  if (((LVar12.convolution_)->kernelsize_).current_size_ < 2) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(pRVar2,2);
    lVar32 = (long)pRVar2->current_size_;
    if (lVar32 != 2) {
      memset(&(LVar12.innerproduct_)->bias_->_internal_metadata_ + lVar32,0,lVar32 * -8 + 0x10);
    }
  }
  pRVar2->current_size_ = 2;
  if (local_f8 == 0) {
    uVar27 = local_ac;
    uVar28 = local_a8;
    if (local_a8 == 0 || local_ac == 0) {
      local_260._0_8_ = local_260 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_260,"Kernel size cannot be 0","");
      errorInCaffeProto((string *)local_260,(local_218->name_).ptr_,(local_218->type_).ptr_);
      if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
        operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
      }
      uVar27 = 3;
      uVar28 = 3;
    }
  }
  else {
    if ((int)local_f8 < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_260,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar13 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_260,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_280,pLVar13);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_260);
    }
    uVar27 = local_f0->elements[0];
    uVar28 = uVar27;
    if (local_f8 != 1) {
      if ((int)local_f8 < 2) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_260,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x476);
        pLVar13 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_260,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_280,pLVar13);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_260);
      }
      uVar28 = *(uint *)&local_f0->field_0xc;
    }
  }
  iVar8 = pRVar2->current_size_;
  if (iVar8 < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_260,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x484);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_260,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_280,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_260);
    iVar8 = pRVar2->current_size_;
  }
  pWVar19 = (LVar12.innerproduct_)->bias_;
  (pWVar19->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)(ulong)uVar27;
  if (iVar8 < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_260,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x484);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_260,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_280,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_260);
    pWVar19 = (LVar12.innerproduct_)->bias_;
  }
  uVar26 = (ulong)uVar28;
  (pWVar19->floatvalue_).current_size_ = (int)uVar26;
  (pWVar19->floatvalue_).total_size_ = (int)(uVar26 >> 0x20);
  uVar28 = local_b4;
  uVar36 = local_b0;
  if (local_120._24_4_ != 0) {
    if ((int)local_120._24_4_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_260,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar13 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_260,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_280,pLVar13);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_260);
    }
    uVar28 = local_100->elements[0];
    uVar36 = uVar28;
    if (local_120._24_4_ != 1) {
      if ((int)local_120._24_4_ < 2) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_260,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x476);
        pLVar13 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_260,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_280,pLVar13);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_260);
      }
      uVar36 = *(uint *)&local_100->field_0xc;
    }
  }
  if (uVar36 == 0 && uVar28 == 0) {
    if ((local_228.convolution_)->_oneof_case_[0] != 0x32) {
      CoreML::Specification::ConvolutionLayerParams::clear_ConvolutionPaddingType
                (local_228.convolution_);
      (local_228.convolution_)->_oneof_case_[0] = 0x32;
      pVVar18 = (ValidPadding *)operator_new(0x20);
      CoreML::Specification::ValidPadding::ValidPadding(pVVar18);
      ((local_228.convolution_)->ConvolutionPaddingType_).valid_ = pVVar18;
    }
  }
  else {
    if ((local_228.convolution_)->_oneof_case_[0] == 0x32) {
      pVVar18 = ((local_228.convolution_)->ConvolutionPaddingType_).valid_;
    }
    else {
      CoreML::Specification::ConvolutionLayerParams::clear_ConvolutionPaddingType
                (local_228.convolution_);
      (local_228.convolution_)->_oneof_case_[0] = 0x32;
      pVVar18 = (ValidPadding *)operator_new(0x20);
      CoreML::Specification::ValidPadding::ValidPadding(pVVar18);
      local_228.pooling_[1].PoolingPaddingType_.valid_ = pVVar18;
    }
    pBVar16 = pVVar18->paddingamounts_;
    if (pBVar16 == (BorderAmounts *)0x0) {
      pBVar16 = (BorderAmounts *)operator_new(0x30);
      CoreML::Specification::BorderAmounts::BorderAmounts(pBVar16);
      pVVar18->paddingamounts_ = pBVar16;
    }
    pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
              Add<google::protobuf::RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes>::TypeHandler>
                        (&(pBVar16->borderamounts_).super_RepeatedPtrFieldBase,(Type *)0x0);
    pTVar17->startedgesize_ = (ulong)uVar28;
    pTVar17->endedgesize_ = (ulong)uVar28;
    if ((local_228.convolution_)->_oneof_case_[0] == 0x32) {
      pVVar18 = ((local_228.convolution_)->ConvolutionPaddingType_).valid_;
    }
    else {
      CoreML::Specification::ConvolutionLayerParams::clear_ConvolutionPaddingType
                (local_228.convolution_);
      (local_228.convolution_)->_oneof_case_[0] = 0x32;
      pVVar18 = (ValidPadding *)operator_new(0x20);
      CoreML::Specification::ValidPadding::ValidPadding(pVVar18);
      local_228.pooling_[1].PoolingPaddingType_.valid_ = pVVar18;
    }
    pBVar16 = pVVar18->paddingamounts_;
    if (pBVar16 == (BorderAmounts *)0x0) {
      pBVar16 = (BorderAmounts *)operator_new(0x30);
      CoreML::Specification::BorderAmounts::BorderAmounts(pBVar16);
      pVVar18->paddingamounts_ = pBVar16;
    }
    pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
              Add<google::protobuf::RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes>::TypeHandler>
                        (&(pBVar16->borderamounts_).super_RepeatedPtrFieldBase,(Type *)0x0);
    pTVar17->startedgesize_ = (ulong)uVar36;
    pTVar17->endedgesize_ = (ulong)uVar36;
  }
  pRVar2 = &(local_228.convolution_)->dilationfactor_;
  if (((local_228.convolution_)->dilationfactor_).current_size_ < 2) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(pRVar2,2);
    lVar32 = (long)pRVar2->current_size_;
    if (lVar32 != 2) {
      memset(&(local_228.scale_)->bias_->_internal_metadata_ + lVar32,0,lVar32 * -8 + 0x10);
    }
  }
  pRVar2->current_size_ = 2;
  if (local_d8 == 0) {
    pvVar35 = (void *)0x1;
    pvVar37 = (void *)0x1;
    iVar8 = 2;
  }
  else {
    if ((int)local_d8 < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_260,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar13 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_260,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_280,pLVar13);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_260);
    }
    pvVar37 = (void *)(ulong)local_d0->elements[0];
    pvVar35 = pvVar37;
    if (local_d8 != 1) {
      if ((int)local_d8 < 2) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_260,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x476);
        pLVar13 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_260,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_280,pLVar13);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_260);
      }
      pvVar35 = (void *)(ulong)*(uint *)&local_d0->field_0xc;
    }
    iVar8 = pRVar2->current_size_;
    if (iVar8 < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_260,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x484);
      pLVar13 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_260,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_280,pLVar13);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_260);
      iVar8 = pRVar2->current_size_;
    }
  }
  pWVar19 = (local_228.scale_)->bias_;
  (pWVar19->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = pvVar37;
  if (iVar8 < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_260,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x484);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_260,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_280,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_260);
    pWVar19 = (local_228.scale_)->bias_;
  }
  uVar24 = local_168;
  *(void **)&(pWVar19->floatvalue_).current_size_ = pvVar35;
  (local_228.convolution_)->outputchannels_ = (uint64)local_188;
  if ((long)local_178 < 0) {
    __assert_fail("kernelChannels >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Convolution.cpp"
                  ,0xe5,
                  "void CoreMLConverter::convertCaffeConvolution(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  (local_228.convolution_)->kernelchannels_ = local_178;
  if ((local_180->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_260,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_260,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_280,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_260);
  }
  uVar28 = *(uint *)((long)((local_180->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x18
                    );
  if ((long)(int)uVar28 < 0) {
    __assert_fail("caffeBlobSizeWeights >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Convolution.cpp"
                  ,0xeb,
                  "void CoreMLConverter::convertCaffeConvolution(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  uVar26 = uVar24 * local_178 * (long)(ulong)uVar27 * uVar26;
  pTVar10 = local_180;
  if (uVar26 - (long)(int)uVar28 != 0) {
    cVar7 = '\x01';
    if (9 < uVar26) {
      uVar24 = uVar26;
      cVar6 = '\x04';
      do {
        cVar7 = cVar6;
        if (uVar24 < 100) {
          cVar7 = cVar7 + -2;
          goto LAB_003eb0a2;
        }
        if (uVar24 < 1000) {
          cVar7 = cVar7 + -1;
          goto LAB_003eb0a2;
        }
        if (uVar24 < 10000) goto LAB_003eb0a2;
        bVar5 = 99999 < uVar24;
        uVar24 = uVar24 / 10000;
        cVar6 = cVar7 + '\x04';
      } while (bVar5);
      cVar7 = cVar7 + '\x01';
    }
LAB_003eb0a2:
    local_1b0 = &local_1a0;
    std::__cxx11::string::_M_construct((ulong)&local_1b0,cVar7);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1b0,(uint)local_1a8,uVar26);
    puVar25 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,0x5e4537);
    local_1d0 = &local_1c0;
    plVar15 = puVar25 + 2;
    if ((long *)*puVar25 == plVar15) {
      local_1c0 = *plVar15;
      uStack_1b8 = puVar25[3];
    }
    else {
      local_1c0 = *plVar15;
      local_1d0 = (long *)*puVar25;
    }
    local_1c8 = puVar25[1];
    *puVar25 = plVar15;
    puVar25[1] = 0;
    *(undefined1 *)(puVar25 + 2) = 0;
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_1d0);
    puVar31 = (ulong *)(plVar15 + 2);
    if ((ulong *)*plVar15 == puVar31) {
      local_200 = *puVar31;
      lStack_1f8 = plVar15[3];
      local_210 = &local_200;
    }
    else {
      local_200 = *puVar31;
      local_210 = (ulong *)*plVar15;
    }
    local_208 = plVar15[1];
    *plVar15 = (long)puVar31;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    uVar27 = 1;
    if (9 < uVar28) {
      uVar36 = uVar28;
      uVar20 = 4;
      do {
        uVar27 = uVar20;
        if (uVar36 < 100) {
          uVar27 = uVar27 - 2;
          goto LAB_003eb1ee;
        }
        if (uVar36 < 1000) {
          uVar27 = uVar27 - 1;
          goto LAB_003eb1ee;
        }
        if (uVar36 < 10000) goto LAB_003eb1ee;
        bVar5 = 99999 < uVar36;
        uVar36 = uVar36 / 10000;
        uVar20 = uVar27 + 4;
      } while (bVar5);
      uVar27 = uVar27 + 1;
    }
LAB_003eb1ee:
    local_1f0 = &local_1e0;
    std::__cxx11::string::_M_construct((ulong)&local_1f0,(char)uVar27);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1f0,uVar27,uVar28);
    uVar24 = 0xf;
    if (local_210 != &local_200) {
      uVar24 = local_200;
    }
    if (uVar24 < (ulong)(local_1e8 + local_208)) {
      uVar24 = 0xf;
      if (local_1f0 != &local_1e0) {
        uVar24 = local_1e0;
      }
      if (uVar24 < (ulong)(local_1e8 + local_208)) goto LAB_003eb26e;
      puVar25 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_210);
    }
    else {
LAB_003eb26e:
      puVar25 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_1f0);
    }
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    psVar21 = puVar25 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar25 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar21) {
      local_280.field_2._M_allocated_capacity = *psVar21;
      local_280.field_2._8_8_ = puVar25[3];
    }
    else {
      local_280.field_2._M_allocated_capacity = *psVar21;
      local_280._M_dataplus._M_p = (pointer)*puVar25;
    }
    local_280._M_string_length = puVar25[1];
    *puVar25 = psVar21;
    puVar25[1] = 0;
    *(undefined1 *)psVar21 = 0;
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_280);
    psVar21 = (size_type *)(plVar15 + 2);
    if ((size_type *)*plVar15 == psVar21) {
      local_260._16_8_ = *psVar21;
      local_260._24_8_ = plVar15[3];
      local_260._0_8_ = local_260 + 0x10;
    }
    else {
      local_260._16_8_ = *psVar21;
      local_260._0_8_ = (size_type *)*plVar15;
    }
    local_260._8_8_ = plVar15[1];
    *plVar15 = (long)psVar21;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    errorInCaffeProto((string *)local_260,(local_218->name_).ptr_,(local_218->type_).ptr_);
    if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
      operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if (local_1f0 != &local_1e0) {
      operator_delete(local_1f0,local_1e0 + 1);
    }
    if (local_210 != &local_200) {
      operator_delete(local_210,local_200 + 1);
    }
    pTVar10 = local_180;
    if (local_1d0 != &local_1c0) {
      operator_delete(local_1d0,local_1c0 + 1);
    }
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0,local_1a0 + 1);
    }
  }
  pWVar19 = (local_228.convolution_)->weights_;
  if (pWVar19 == (WeightParams *)0x0) {
    pWVar19 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar19);
    (local_228.convolution_)->weights_ = pWVar19;
  }
  if (uVar26 >> 0x1f != 0) {
    __assert_fail("blobSize <= INT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Convolution.cpp"
                  ,0xf0,
                  "void CoreMLConverter::convertCaffeConvolution(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  pRVar1 = &pWVar19->floatvalue_;
  iVar8 = (int)uVar26;
  if (pRVar1->current_size_ < iVar8) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar8);
    iVar9 = pRVar1->current_size_;
    if (iVar9 != iVar8) {
      memset(((pWVar19->floatvalue_).rep_)->elements + iVar9,0,uVar26 * 4 + (long)iVar9 * -4);
    }
  }
  pRVar1->current_size_ = iVar8;
  if ((pTVar10->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_260,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_260,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_280,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_260);
  }
  pvVar35 = ((pTVar10->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0];
  if ((RepeatedField<float> *)((long)pvVar35 + 0x18) != pRVar1) {
    pRVar1->current_size_ = 0;
    iVar8 = *(int *)((long)pvVar35 + 0x18);
    if (iVar8 != 0) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar8);
      memcpy(((pWVar19->floatvalue_).rep_)->elements + (pWVar19->floatvalue_).current_size_,
             (void *)(*(long *)((long)pvVar35 + 0x20) + 8),(long)*(int *)((long)pvVar35 + 0x18) << 2
            );
      (pWVar19->floatvalue_).current_size_ =
           (pWVar19->floatvalue_).current_size_ + *(int *)((long)pvVar35 + 0x18);
    }
  }
  if (local_219 == false) goto LAB_003eba1e;
  uVar27 = (uint)local_188;
  if ((uint)local_170 != (uint)local_188) {
    cVar7 = '\x01';
    if (9 < (uint)local_188) {
      pTVar29 = local_188;
      cVar6 = '\x04';
      do {
        cVar7 = cVar6;
        uVar28 = (uint)pTVar29;
        if (uVar28 < 100) {
          cVar7 = cVar7 + -2;
          goto LAB_003eb589;
        }
        if (uVar28 < 1000) {
          cVar7 = cVar7 + -1;
          goto LAB_003eb589;
        }
        if (uVar28 < 10000) goto LAB_003eb589;
        pTVar29 = (Type *)(((ulong)pTVar29 & 0xffffffff) / 10000);
        cVar6 = cVar7 + '\x04';
      } while (99999 < uVar28);
      cVar7 = cVar7 + '\x01';
    }
LAB_003eb589:
    local_1b0 = &local_1a0;
    std::__cxx11::string::_M_construct((ulong)&local_1b0,cVar7);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1b0,(uint)local_1a8,uVar27);
    puVar25 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,0x5e4537);
    local_1d0 = &local_1c0;
    plVar15 = puVar25 + 2;
    if ((long *)*puVar25 == plVar15) {
      local_1c0 = *plVar15;
      uStack_1b8 = puVar25[3];
    }
    else {
      local_1c0 = *plVar15;
      local_1d0 = (long *)*puVar25;
    }
    local_1c8 = puVar25[1];
    *puVar25 = plVar15;
    puVar25[1] = 0;
    *(undefined1 *)(puVar25 + 2) = 0;
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_1d0);
    puVar31 = (ulong *)(plVar15 + 2);
    if ((ulong *)*plVar15 == puVar31) {
      local_200 = *puVar31;
      lStack_1f8 = plVar15[3];
      local_210 = &local_200;
    }
    else {
      local_200 = *puVar31;
      local_210 = (ulong *)*plVar15;
    }
    local_208 = plVar15[1];
    *plVar15 = (long)puVar31;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    uVar28 = (uint)local_170;
    uVar27 = -uVar28;
    if (0 < (int)uVar28) {
      uVar27 = uVar28;
    }
    uVar28 = 1;
    if (9 < uVar27) {
      uVar26 = (ulong)uVar27;
      uVar36 = 4;
      do {
        uVar28 = uVar36;
        uVar20 = (uint)uVar26;
        if (uVar20 < 100) {
          uVar28 = uVar28 - 2;
          goto LAB_003eb6e7;
        }
        if (uVar20 < 1000) {
          uVar28 = uVar28 - 1;
          goto LAB_003eb6e7;
        }
        if (uVar20 < 10000) goto LAB_003eb6e7;
        uVar26 = uVar26 / 10000;
        uVar36 = uVar28 + 4;
      } while (99999 < uVar20);
      uVar28 = uVar28 + 1;
    }
LAB_003eb6e7:
    uVar26 = local_170 >> 0x1f;
    local_1f0 = &local_1e0;
    std::__cxx11::string::_M_construct
              ((ulong)&local_1f0,(char)uVar28 - ((char)(local_170 >> 0x18) >> 7));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((uVar26 & 1) + (long)local_1f0),uVar28,uVar27);
    uVar26 = 0xf;
    if (local_210 != &local_200) {
      uVar26 = local_200;
    }
    if (uVar26 < (ulong)(local_1e8 + local_208)) {
      uVar26 = 0xf;
      if (local_1f0 != &local_1e0) {
        uVar26 = local_1e0;
      }
      if (uVar26 < (ulong)(local_1e8 + local_208)) goto LAB_003eb778;
      puVar25 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_210);
    }
    else {
LAB_003eb778:
      puVar25 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_1f0);
    }
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    psVar21 = puVar25 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar25 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar21) {
      local_280.field_2._M_allocated_capacity = *psVar21;
      local_280.field_2._8_8_ = puVar25[3];
    }
    else {
      local_280.field_2._M_allocated_capacity = *psVar21;
      local_280._M_dataplus._M_p = (pointer)*puVar25;
    }
    local_280._M_string_length = puVar25[1];
    *puVar25 = psVar21;
    puVar25[1] = 0;
    *(undefined1 *)psVar21 = 0;
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_280);
    psVar21 = (size_type *)(plVar15 + 2);
    if ((size_type *)*plVar15 == psVar21) {
      local_260._16_8_ = *psVar21;
      local_260._24_8_ = plVar15[3];
      local_260._0_8_ = local_260 + 0x10;
    }
    else {
      local_260._16_8_ = *psVar21;
      local_260._0_8_ = (size_type *)*plVar15;
    }
    local_260._8_8_ = plVar15[1];
    *plVar15 = (long)psVar21;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    errorInCaffeProto((string *)local_260,(local_218->name_).ptr_,(local_218->type_).ptr_);
    if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
      operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if (local_1f0 != &local_1e0) {
      operator_delete(local_1f0,local_1e0 + 1);
    }
    if (local_210 != &local_200) {
      operator_delete(local_210,local_200 + 1);
    }
    pTVar10 = local_180;
    if (local_1d0 != &local_1c0) {
      operator_delete(local_1d0,local_1c0 + 1);
    }
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0,local_1a0 + 1);
    }
  }
  pWVar19 = (local_228.convolution_)->bias_;
  if (pWVar19 == (WeightParams *)0x0) {
    pWVar19 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar19);
    (local_228.convolution_)->bias_ = pWVar19;
  }
  pTVar29 = local_188;
  iVar8 = (int)local_188;
  if (iVar8 < 0) {
    __assert_fail("outputChannels <= INT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Convolution.cpp"
                  ,0xfb,
                  "void CoreMLConverter::convertCaffeConvolution(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  pRVar1 = &pWVar19->floatvalue_;
  if (pRVar1->current_size_ < iVar8) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar8);
    iVar9 = pRVar1->current_size_;
    if (iVar9 != iVar8) {
      memset(((pWVar19->floatvalue_).rep_)->elements + iVar9,0,(long)pTVar29 * 4 + (long)iVar9 * -4)
      ;
    }
  }
  pRVar1->current_size_ = iVar8;
  if ((pTVar10->blobs_).super_RepeatedPtrFieldBase.current_size_ < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_260,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_260,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_280,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_260);
  }
  lVar32 = *(long *)((pTVar10->blobs_).super_RepeatedPtrFieldBase.rep_ + 1);
  if ((RepeatedField<float> *)(lVar32 + 0x18) != pRVar1) {
    pRVar1->current_size_ = 0;
    iVar8 = *(int *)(lVar32 + 0x18);
    if (iVar8 != 0) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar8);
      memcpy(((pWVar19->floatvalue_).rep_)->elements + (pWVar19->floatvalue_).current_size_,
             (void *)(*(long *)(lVar32 + 0x20) + 8),(long)*(int *)(lVar32 + 0x18) << 2);
      (pWVar19->floatvalue_).current_size_ =
           (pWVar19->floatvalue_).current_size_ + *(int *)(lVar32 + 0x18);
    }
  }
LAB_003eba1e:
  caffe::ConvolutionParameter::~ConvolutionParameter((ConvolutionParameter *)local_120);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeConvolution(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(),
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    
    caffe::ConvolutionParameter caffeLayerParams = caffeLayer.convolution_param();
    Specification::ConvolutionLayerParams* specLayerParams = specLayer->mutable_convolution();

    // weights shape for coreml and caffe:
    // convolution ==> [outputChannels, kernelChannels, kernelHeight, kernelWidth] == [outputChannelsWeight, kernelChannels, kernelHeight, kernelWidth]
    // deconvoltuion ==> [kernelChannels, outputChannels / nGroups, kernelHeight, kernelWidth] == [kernelChannels, outputChannelsWeight, kernelHeight, kernelWidth]
    uint32_t outputChannels = caffeLayerParams.num_output();
    int64_t outputChannelsWeight = 0;
    int64_t kernelChannels = 0;
    
    // First check that weights exist.
    if (caffeLayerWeights.blobs_size() == 0){
        CoreMLConverter::errorInCaffeProto("Weight blobs not provided", caffeLayer.name(), caffeLayer.type());
    }
    
    //check that groups are not 0
    uint32_t numberGroups = caffeLayerParams.group();
    if (numberGroups==0) {
        CoreMLConverter::errorInCaffeProto("group parameter cannot be 0", caffeLayer.name(), caffeLayer.type());
    }
    
    if (caffeLayerWeights.blobs_size() == 2 || caffeLayerWeights.blobs_size() == 1){
        
        // Sometimes caffe models do not populate the shape (infering from other parameters)
        if (caffeLayerWeights.blobs(0).shape().dim_size() == 0) {
            outputChannelsWeight = caffeLayerWeights.blobs(0).num();
            kernelChannels = caffeLayerWeights.blobs(0).channels();
        } else {
            if (caffeLayer.type() == "Deconvolution") {
                outputChannelsWeight = caffeLayerWeights.blobs(0).shape().dim(1);
                kernelChannels = caffeLayerWeights.blobs(0).shape().dim(0);
            } else {
                outputChannelsWeight = caffeLayerWeights.blobs(0).shape().dim(0);
                kernelChannels = caffeLayerWeights.blobs(0).shape().dim(1);
            }
        }
    } else {
        CoreMLConverter::errorInCaffeProto("Number of blobs must be 2 or 1 (when there is no bias)", caffeLayer.name(), caffeLayer.type());
    }
    
    bool hasBias = caffeLayerParams.bias_term();
    int caffeBiasLength = 0;
    if (caffeLayerWeights.blobs_size()>1){
        caffeBiasLength = caffeLayerWeights.blobs(1).data_size();
    }
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayer.type() == "Deconvolution") {
        if (outputChannels!= outputChannelsWeight * numberGroups){
            CoreMLConverter::errorInCaffeProto(
                                               "'num_output' ("+std::to_string(outputChannels)+") divided by groups (" + std::to_string(numberGroups) + "does not match the first dimension of weights ("+std::to_string(outputChannelsWeight)+")"
                                               ,caffeLayer.name(), caffeLayer.type());
        }
    } else {
        if (outputChannels!= outputChannelsWeight){
            CoreMLConverter::errorInCaffeProto(
                    "'num_output' ("+std::to_string(outputChannels)+") does not match the first dimension of weights ("+std::to_string(outputChannelsWeight)+")"
                            ,caffeLayer.name(), caffeLayer.type());
        }
        if (outputChannels % numberGroups != 0){
            CoreMLConverter::errorInCaffeProto("'num_output' ("+std::to_string(outputChannels)+") must be divisible by 'groups' (" + std::to_string(numberGroups) + ")"
                                               ,caffeLayer.name(), caffeLayer.type());
        }
    }
    if ( (hasBias && caffeBiasLength==0) || (!hasBias && caffeBiasLength>0)){
        CoreMLConverter::errorInCaffeProto("'bias_term' flag and blob size for bias incompatible", caffeLayer.name(), caffeLayer.type());
    }
    if (caffeLayerParams.axis() != 1) {
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis",caffeLayer.name(),
                                                             caffeLayer.type(), std::to_string(caffeLayerParams.axis()));
    }
    if (caffeLayerParams.kernel_size_size()>2){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("Number of kernel size values", caffeLayer.name(),
                                                             caffeLayer.type(), std::to_string(caffeLayerParams.kernel_size_size()));
    }
    if (caffeLayerParams.pad_size()>2){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("Number of pad values", caffeLayer.name(),
                                                             caffeLayer.type(), std::to_string(caffeLayerParams.pad_size()));
    }
    if (caffeLayerParams.stride_size()>2){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("Number of stride values", caffeLayer.name(),
                                                             caffeLayer.type(), std::to_string(caffeLayerParams.stride_size()));
    }
    
    if (caffeLayerParams.dilation_size()>2){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("Number of dilation size values", caffeLayer.name(),
                                                             caffeLayer.type(), std::to_string(caffeLayerParams.dilation_size()));
    }
    //**************************************************************
    
    if (caffeLayer.type() == "Deconvolution"){
        specLayerParams->set_isdeconvolution(true);
    } else {
        specLayerParams->set_isdeconvolution(false);
    }
    specLayerParams->set_hasbias(hasBias);
    assert(numberGroups >= 0);
    specLayerParams->set_ngroups(static_cast<uint64_t>(numberGroups));
    
    //Set Stride
    ::google::protobuf::RepeatedField<uint64_t>* stride = specLayerParams->mutable_stride();
    stride->Resize(2, 0);
    uint32_t heightStride, widthStride;
    heightStride = widthStride = 1;
    if (caffeLayerParams.stride_size() != 0) {
        heightStride = caffeLayerParams.stride(0);
        if (caffeLayerParams.stride_size() == 1){
            widthStride = heightStride;
        } else {
            widthStride = caffeLayerParams.stride(1);
        }
    } else if (caffeLayerParams.stride_h() != 0 && caffeLayerParams.stride_w() != 0) {
        heightStride = caffeLayerParams.stride_h();
        widthStride = caffeLayerParams.stride_w();
    }
    specLayerParams->set_stride(0, static_cast<uint64_t>(heightStride));
    specLayerParams->set_stride(1, static_cast<uint64_t>(widthStride));
    
    //Set Kernel sizes
    ::google::protobuf::RepeatedField<uint64_t>* kernelSize = specLayerParams->mutable_kernelsize();
    kernelSize->Resize(2, 0);
    uint32_t Kh, Kw;
    Kh = Kw = 3;
    if (caffeLayerParams.kernel_size_size() != 0) {
        Kh = caffeLayerParams.kernel_size(0);
        if (caffeLayerParams.kernel_size_size() == 1){
            Kw = Kh;
        } else {
            Kw = caffeLayerParams.kernel_size(1);
        }
    } else if (caffeLayerParams.kernel_h() != 0 && caffeLayerParams.kernel_w() != 0) {
        Kh = caffeLayerParams.kernel_h();
        Kw = caffeLayerParams.kernel_w();
    } else {
        CoreMLConverter::errorInCaffeProto("Kernel size cannot be 0", caffeLayer.name(), caffeLayer.type());
    }
    specLayerParams->set_kernelsize(0, static_cast<uint64_t>(Kh));
    specLayerParams->set_kernelsize(1, static_cast<uint64_t>(Kw));
    
    //Set padding params
    uint32_t pad_h = 0;
    uint32_t pad_w = 0;
    if (caffeLayerParams.pad_size() != 0) {
        pad_h = caffeLayerParams.pad(0);
        if (caffeLayerParams.pad_size()==1){
            pad_w = pad_h;
        } else {
            pad_w = caffeLayerParams.pad(1);
        }
    } else {
        pad_h = caffeLayerParams.pad_h();
        pad_w = caffeLayerParams.pad_w();
    }
    if (pad_w==0 && pad_h==0){
        (void) specLayerParams->mutable_valid();
    } else {
        auto heightBorder = specLayerParams->mutable_valid()->mutable_paddingamounts()->add_borderamounts();
        heightBorder->set_startedgesize(static_cast<uint64_t>(pad_h));
        heightBorder->set_endedgesize(static_cast<uint64_t>(pad_h));
        auto widthBorder = specLayerParams->mutable_valid()->mutable_paddingamounts()->add_borderamounts();
        widthBorder->set_startedgesize(static_cast<uint64_t>(pad_w));
        widthBorder->set_endedgesize(static_cast<uint64_t>(pad_w));
    }
    
    //Set dilation params
    ::google::protobuf::RepeatedField<uint64_t>* dilation = specLayerParams->mutable_dilationfactor();
    dilation->Resize(2, 0);
    uint32_t heightDilation, widthDilation;
    heightDilation = widthDilation = 1;
    if (caffeLayerParams.dilation_size() != 0) {
        heightDilation = caffeLayerParams.dilation(0);
        if (caffeLayerParams.dilation_size() == 1){
            widthDilation = heightDilation;
        } else {
            widthDilation = caffeLayerParams.dilation(1);
        }
    }
    specLayerParams->set_dilationfactor(0, static_cast<uint64_t>(heightDilation));
    specLayerParams->set_dilationfactor(1, static_cast<uint64_t>(widthDilation));
    
    // Write weights
    assert(outputChannels >= 0);
    specLayerParams->set_outputchannels(static_cast<uint64_t>(outputChannels));
    assert(kernelChannels >= 0);
    specLayerParams->set_kernelchannels(static_cast<uint64_t>(kernelChannels));
    
    uint64_t blobSize = static_cast<uint64_t>(outputChannelsWeight) * static_cast<uint64_t>(kernelChannels) * static_cast<uint64_t>(Kh) * static_cast<uint64_t>(Kw);
    
    int caffeBlobSizeWeights = caffeLayerWeights.blobs(0).data_size();
    assert(caffeBlobSizeWeights >= 0);
    if (static_cast<uint64_t>(caffeBlobSizeWeights) != blobSize) {
        CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(blobSize)+" but found blob of size = "+std::to_string     (caffeBlobSizeWeights)+" in caffe", caffeLayer.name(), caffeLayer.type());
    }
    ::google::protobuf::RepeatedField<float>* weights = specLayerParams->mutable_weights()->mutable_floatvalue();
    assert(blobSize <= INT_MAX);
    weights->Resize(static_cast<int32_t>(blobSize), 0.0);
    weights->CopyFrom(caffeLayerWeights.blobs(0).data());
    
    // Write bias
    if (hasBias) {
        if (caffeBiasLength != static_cast<int32_t>(outputChannels)) {
            CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(outputChannels)+" but found blob of size = "+std::to_string(caffeBiasLength)+" in caffe"
                              , caffeLayer.name(), caffeLayer.type());
        }
        ::google::protobuf::RepeatedField<float>* bias = specLayerParams->mutable_bias()->mutable_floatvalue();
        assert(outputChannels <= INT_MAX);
        bias->Resize(static_cast<int32_t>(outputChannels), 0.0);
        bias->CopyFrom(caffeLayerWeights.blobs(1).data());
    }
}